

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggx.cpp
# Opt level: O3

float __thiscall ggx::calculateNDF(ggx *this,vec3 *h)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar1 = (h->field_0).field_0.z;
  fVar4 = (h->field_0).field_0.x / fVar1;
  fVar3 = (h->field_0).field_0.y / fVar1;
  fVar2 = this->_alpha;
  fVar3 = 1.0 / (((fVar4 * fVar4 + fVar3 * fVar3) / fVar2) / fVar2 + 1.0);
  return (fVar3 * fVar3) / (fVar2 * 3.14159 * fVar2 * fVar1 * fVar1 * fVar1 * fVar1);
}

Assistant:

float ggx::calculateNDF(const glm::vec3 &h) const
{
  // tan(theta) = sqrt(x^2 + y^2) / z
  // tan(theta)^2 = (x^2/z^2) + (y^2/z^2) = (x/z)^2 + (y/z)^2
  const float slope_x = h.x/h.z;
  const float slope_y = h.y/h.z;
  const float tan_theta_sq = (slope_x*slope_x + slope_y*slope_y);

  // Alternate form is result of dividing by alpha^2 inside parentheses in denominator in the GGX classic form.
  // This form is also equal to Disney form:
  //   cos(theta)^4 (alpha^2 + tan(theta)^2) = (alpha^2 cos(theta)^2 + sin(theta)^2)^2 =
  //     = (alpha^2 cos(theta)^2 + 1 - cos(theta)^2) = (cos(theta)^2 (alpha^2 - 1) + 1)^2

  float ndf = 1.0f / (1.0f + tan_theta_sq/_alpha/_alpha);
  ndf = (ndf*ndf) / (3.14159f * _alpha * _alpha * h.z*h.z*h.z*h.z);

  return ndf;
}